

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

bool __thiscall wasm::PassRunner::shouldPreserveDWARF(PassRunner *this)

{
  bool bVar1;
  
  bVar1 = Debug::shouldPreserveDWARF(&this->options,this->wasm);
  return (bool)(bVar1 & (this->addedPassesRemovedDWARF ^ 1U));
}

Assistant:

bool PassRunner::shouldPreserveDWARF() {
  // Check if the debugging subsystem wants to preserve DWARF.
  if (!Debug::shouldPreserveDWARF(options, *wasm)) {
    return false;
  }

  // We may need DWARF. Check if one of our previous passes would remove it
  // anyhow, in which case, there is nothing to preserve.
  if (addedPassesRemovedDWARF) {
    return false;
  }

  return true;
}